

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_comparison_join.cpp
# Opt level: O2

InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
duckdb::LogicalComparisonJoin::ParamsToString_abi_cxx11_
          (InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,LogicalComparisonJoin *this)

{
  pointer pJVar1;
  pointer pJVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  const_reference this_00;
  pointer pEVar4;
  pointer pBVar5;
  ulong __n;
  long *local_88;
  string local_80;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_60;
  string conditions_info;
  
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->map).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_buckets =
       &(__return_storage_ptr__->map_idx)._M_h._M_single_bucket;
  (__return_storage_ptr__->map_idx)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->map_idx)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->map_idx)._M_h._M_element_count = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->map_idx)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->map_idx)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  EnumUtil::ToChars<duckdb::JoinType>((this->super_LogicalJoin).super_LogicalOperator.field_0x61);
  ::std::__cxx11::string::string((string *)&conditions_info,"Join Type",(allocator *)&local_80);
  pbVar3 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](__return_storage_ptr__,&conditions_info);
  ::std::__cxx11::string::assign((char *)pbVar3);
  ::std::__cxx11::string::~string((string *)&conditions_info);
  conditions_info._M_dataplus._M_p = (pointer)&conditions_info.field_2;
  conditions_info._M_string_length = 0;
  conditions_info.field_2._M_local_buf[0] = '\0';
  __n = 0;
  while( true ) {
    pJVar1 = (this->conditions).
             super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
             super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pJVar2 = (this->conditions).
             super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
             super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pJVar2 - (long)pJVar1) / 0x18) <= __n) break;
    if (__n != 0) {
      ::std::__cxx11::string::append((char *)&conditions_info);
    }
    this_00 = vector<duckdb::JoinCondition,_true>::get<true>(&this->conditions,__n);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&this_00->left);
    (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_80,pEVar4);
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&this_00->right);
    (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_60,pEVar4);
    make_uniq<duckdb::BoundComparisonExpression,duckdb::ExpressionType_const&,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((duckdb *)&local_88,&this_00->comparison,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_80,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_60);
    if (local_60._M_head_impl != (Expression *)0x0) {
      (*((local_60._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    if ((long *)local_80._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_80._M_dataplus._M_p + 8))();
    }
    pBVar5 = unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
             ::operator->((unique_ptr<duckdb::BoundComparisonExpression,_std::default_delete<duckdb::BoundComparisonExpression>,_true>
                           *)&local_88);
    (*(pBVar5->super_Expression).super_BaseExpression._vptr_BaseExpression[8])(&local_80,pBVar5);
    ::std::__cxx11::string::append((string *)&conditions_info);
    ::std::__cxx11::string::~string((string *)&local_80);
    if (local_88 != (long *)0x0) {
      (**(code **)(*local_88 + 8))();
    }
    __n = __n + 1;
  }
  if ((this->predicate).
      super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
      super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0) {
    if (pJVar1 != pJVar2) {
      ::std::__cxx11::string::append((char *)&conditions_info);
    }
    pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
             operator->(&this->predicate);
    (*(pEVar4->super_BaseExpression)._vptr_BaseExpression[8])(&local_80,pEVar4);
    ::std::__cxx11::string::append((string *)&conditions_info);
    ::std::__cxx11::string::~string((string *)&local_80);
  }
  ::std::__cxx11::string::string((string *)&local_80,"Conditions",(allocator *)&local_88);
  pbVar3 = InsertionOrderPreservingMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator[](__return_storage_ptr__,&local_80);
  ::std::__cxx11::string::_M_assign((string *)pbVar3);
  ::std::__cxx11::string::~string((string *)&local_80);
  LogicalOperator::SetParamsEstimatedCardinality((LogicalOperator *)this,__return_storage_ptr__);
  ::std::__cxx11::string::~string((string *)&conditions_info);
  return __return_storage_ptr__;
}

Assistant:

InsertionOrderPreservingMap<string> LogicalComparisonJoin::ParamsToString() const {
	InsertionOrderPreservingMap<string> result;
	result["Join Type"] = EnumUtil::ToChars(join_type);

	string conditions_info;
	for (idx_t i = 0; i < conditions.size(); i++) {
		if (i > 0) {
			conditions_info += "\n";
		}
		auto &condition = conditions[i];
		auto expr =
		    make_uniq<BoundComparisonExpression>(condition.comparison, condition.left->Copy(), condition.right->Copy());
		conditions_info += expr->ToString();
	}
	if (predicate) {
		if (!conditions.empty()) {
			conditions_info += "\n";
		}
		conditions_info += predicate->ToString();
	}
	result["Conditions"] = conditions_info;
	SetParamsEstimatedCardinality(result);

	return result;
}